

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O2

llb_build_key_t * llb_build_key_make_node(char *path)

{
  CAPIBuildKey *this;
  char *pcVar1;
  size_t in_RCX;
  StringRef path_00;
  BuildKey BStack_38;
  
  this = (CAPIBuildKey *)operator_new(0x38);
  if (path == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = (char *)strlen(path);
  }
  path_00.Length = in_RCX;
  path_00.Data = pcVar1;
  llbuild::buildsystem::BuildKey::makeNode(&BStack_38,(BuildKey *)path,path_00);
  anon_unknown.dwarf_243886::CAPIBuildKey::CAPIBuildKey(this,&BStack_38);
  std::__cxx11::string::_M_dispose();
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make_node(const char *path) {
  return (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeNode(StringRef(path)));
}